

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ptls_openssl_decrypt_ticket_evp
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb)

{
  ptls_buffer_t *ppVar1;
  int iVar2;
  int iVar3;
  EVP_CIPHER_CTX *ctx;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  EVP_MAC_CTX *pEVar8;
  int clen;
  size_t hlen;
  uint8_t hmac [64];
  int local_94;
  uint8_t *local_90;
  ptls_buffer_t *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [72];
  
  uVar6 = src.len;
  ctx = EVP_CIPHER_CTX_new();
  iVar3 = 0x201;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    lVar4 = 0;
  }
  else {
    pEVar8 = (EVP_MAC_CTX *)0x0;
    local_90 = src.base;
    local_88 = buf;
    lVar4 = EVP_MAC_fetch(0,"HMAC",0);
    if (lVar4 == 0) {
      lVar4 = 0;
      goto LAB_0010c64c;
    }
    pEVar8 = (EVP_MAC_CTX *)EVP_MAC_CTX_new(lVar4);
    if (pEVar8 != (EVP_MAC_CTX *)0x0) {
      iVar3 = 0x32;
      if (uVar6 < 0x20) goto LAB_0010c64c;
      iVar2 = (*cb)(local_90,local_90 + 0x10,(EVP_CIPHER_CTX *)ctx,pEVar8,0);
      if (iVar2 != 0) {
        sVar5 = EVP_MAC_CTX_get_mac_size(pEVar8);
        if (uVar6 < sVar5 + 0x20) goto LAB_0010c64c;
        lVar7 = uVar6 - sVar5;
        iVar3 = EVP_MAC_update(pEVar8,local_90,lVar7);
        if ((iVar3 != 0) && (iVar3 = EVP_MAC_final(pEVar8,local_78,local_80,0x40), iVar3 != 0)) {
          iVar3 = (*ptls_mem_equal)(local_90 + lVar7,local_78,sVar5);
          ppVar1 = local_88;
          if (iVar3 == 0) {
            iVar3 = 0x28;
            goto LAB_0010c64c;
          }
          iVar3 = ptls_buffer_reserve(local_88,lVar7 - 0x20U);
          if (iVar3 != 0) goto LAB_0010c64c;
          iVar3 = EVP_DecryptUpdate(ctx,ppVar1->base + ppVar1->off,&local_94,local_90 + 0x20,
                                    (int)(lVar7 - 0x20U));
          if (iVar3 != 0) {
            sVar5 = (long)local_94 + ppVar1->off;
            ppVar1->off = sVar5;
            iVar3 = EVP_DecryptFinal_ex(ctx,ppVar1->base + sVar5,&local_94);
            if (iVar3 != 0) {
              ppVar1->off = ppVar1->off + (long)local_94;
              iVar3 = 0;
              goto LAB_0010c64c;
            }
          }
        }
      }
      iVar3 = 0x203;
      goto LAB_0010c64c;
    }
  }
  pEVar8 = (EVP_MAC_CTX *)0x0;
LAB_0010c64c:
  if (ctx != (EVP_CIPHER_CTX *)0x0) {
    EVP_CIPHER_CTX_free(ctx);
  }
  if (pEVar8 != (EVP_MAC_CTX *)0x0) {
    EVP_MAC_CTX_free(pEVar8);
  }
  if (lVar4 != 0) {
    EVP_MAC_free(lVar4);
  }
  return iVar3;
}

Assistant:

int ptls_openssl_decrypt_ticket_evp(ptls_buffer_t *buf, ptls_iovec_t src,
                                    int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, EVP_MAC_CTX *hctx,
                                              int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    EVP_MAC *mac = NULL;
    EVP_MAC_CTX *hctx = NULL;
    size_t hlen;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((mac = EVP_MAC_fetch(NULL, "HMAC", NULL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = EVP_MAC_CTX_new(mac)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = EVP_MAC_CTX_get_mac_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!EVP_MAC_update(hctx, src.base, src.len) || !EVP_MAC_final(hctx, hmac, &hlen, sizeof(hmac))) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        EVP_MAC_CTX_free(hctx);
    if (mac != NULL)
        EVP_MAC_free(mac);
    return ret;
}